

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.scanner.c
# Opt level: O0

void yyunput(int c,char *yy_bp)

{
  char *local_38;
  char *source;
  char *dest;
  char *pcStack_20;
  int number_to_move;
  char *yy_cp;
  char *yy_bp_local;
  int c_local;
  
  pcStack_20 = yy_c_buf_p;
  *yy_c_buf_p = yy_hold_char;
  yy_cp = yy_bp;
  if (pcStack_20 < yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + 2) {
    local_38 = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + (yy_n_chars + 2);
    source = yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf +
             (yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size + 2);
    while (yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf < local_38) {
      source[-1] = local_38[-1];
      local_38 = local_38 + -1;
      source = source + -1;
    }
    pcStack_20 = pcStack_20 + ((int)source - (int)local_38);
    yy_cp = yy_bp + ((int)source - (int)local_38);
    yy_n_chars = yy_buffer_stack[yy_buffer_stack_top]->yy_buf_size;
    yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars = yy_n_chars;
    if (pcStack_20 < yy_buffer_stack[yy_buffer_stack_top]->yy_ch_buf + 2) {
      yy_fatal_error("flex scanner push-back overflow");
    }
  }
  pcStack_20[-1] = (char)c;
  yytext = yy_cp;
  yy_hold_char = pcStack_20[-1];
  yy_c_buf_p = pcStack_20 + -1;
  return;
}

Assistant:

static void yyunput (int c, char * yy_bp )
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}